

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetPrivkeyFromExtkey(void *handle,char *extkey,int network_type,char **privkey,char **wif)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  allocator local_ab;
  HDWalletApi api;
  bool is_bitcoin;
  char *work_privkey;
  void *local_a0;
  char *work_wif;
  string key;
  string local_70;
  string local_50;
  
  work_privkey = (char *)0x0;
  work_wif = (char *)0x0;
  local_a0 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(extkey);
  if (bVar1) {
    key._M_dataplus._M_p = "cfdcapi_key.cpp";
    key._M_string_length = CONCAT44(key._M_string_length._4_4_,0x78b);
    key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a162a;
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"extkey is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. extkey is null or empty.",(allocator *)&local_50
              );
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&key);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = true;
  net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
  if (is_bitcoin != false) {
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    key.field_2._M_allocated_capacity = key.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (privkey == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,extkey,&local_ab);
      cfd::api::HDWalletApi::GetPrivkeyFromExtkey(&local_50,&api,&local_70,net_type,false,true);
      std::__cxx11::string::operator=((string *)&key,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      pcVar2 = cfd::capi::CreateString(&key);
      work_privkey = pcVar2;
    }
    if (wif == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,extkey,&local_ab);
      cfd::api::HDWalletApi::GetPrivkeyFromExtkey(&local_50,&api,&local_70,net_type,true,true);
      std::__cxx11::string::operator=((string *)&key,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      pcVar3 = cfd::capi::CreateString(&key);
    }
    if (pcVar2 != (char *)0x0) {
      *privkey = pcVar2;
    }
    if (pcVar3 != (char *)0x0) {
      *wif = pcVar3;
    }
    std::__cxx11::string::~string((string *)&key);
    return 0;
  }
  key._M_dataplus._M_p = "cfdcapi_key.cpp";
  key._M_string_length = CONCAT44(key._M_string_length._4_4_,0x794);
  key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a162a;
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey\'s network_type is invalid.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to parameter. privkey\'s network_type is invalid.",
             (allocator *)&local_50);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&key);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyFromExtkey(
    void* handle, const char* extkey, int network_type, char** privkey,
    char** wif) {
  char* work_privkey = nullptr;
  char* work_wif = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(extkey)) {
      warn(CFD_LOG_SOURCE, "extkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    HDWalletApi api;
    std::string key;
    if (privkey != nullptr) {
      key = api.GetPrivkeyFromExtkey(extkey, net_type, false);
      work_privkey = CreateString(key);
    }
    if (wif != nullptr) {
      key = api.GetPrivkeyFromExtkey(extkey, net_type, true);
      work_wif = CreateString(key);
    }

    if (work_privkey != nullptr) *privkey = work_privkey;
    if (work_wif != nullptr) *wif = work_wif;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_privkey, &work_wif);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_privkey, &work_wif);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_privkey, &work_wif);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}